

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O2

void __thiscall xray_re::xr_custom_object::save_v12(xr_custom_object *this,xr_ini_writer *w)

{
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  string asStack_38 [32];
  
  xr_ini_writer::write(w,0x1d1f12,(void *)(ulong)this->m_class_id,in_RCX);
  xr_ini_writer::write(w,0x1d1f18,(void *)(ulong)this->m_flags,in_RCX);
  xr_ini_writer::write(w,0x1c66ca,(void *)0x0,in_RCX);
  std::__cxx11::string::string(asStack_38,(string *)&this->m_name);
  __n = 0;
  xr_ini_writer::write(w,0x1d03c6,asStack_38,0);
  std::__cxx11::string::~string(asStack_38);
  xr_ini_writer::write(w,0x1d2962,__buf,__n);
  xr_ini_writer::write(w,0x1d1f21,__buf_00,__n);
  xr_ini_writer::write(w,0x1d1f2a,__buf_01,__n);
  return;
}

Assistant:

void xr_custom_object::save_v12(xr_ini_writer* w) const
{
	w->write("clsid", m_class_id);
	w->write("co_flags", m_flags);
	w->write("flags", 0);
	w->write("name", m_name, false);
	w->write("position", m_position);
	w->write("rotation", m_rotation);
	w->write("scale", m_scale);
}